

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::ProducedNodeTask::start(ProducedNodeTask *this,TaskInterface ti)

{
  pointer ppCVar1;
  BuildSystemDelegate *pBVar2;
  Node *pNVar3;
  TaskInterface ti_00;
  int iVar4;
  undefined4 extraout_var;
  BuildSystemImpl *pBVar6;
  size_t sVar7;
  void *pvVar8;
  void *pvVar9;
  StringRef name;
  _Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  local_88;
  _Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  local_68;
  string local_50 [32];
  Command *pCVar5;
  
  pvVar8 = ti.ctx;
  pvVar9 = ti.impl;
  ppCVar1 = (this->node->producers).
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar7 = (long)(this->node->producers).
                super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1;
  if (sVar7 == 8) {
    pCVar5 = *ppCVar1;
  }
  else {
    pBVar6 = getBuildSystem(ti);
    pBVar2 = pBVar6->delegate;
    pNVar3 = this->node;
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            *)&local_88,&pNVar3->producers);
    iVar4 = (*pBVar2->_vptr_BuildSystemDelegate[0x11])(pBVar2,pNVar3,&local_88);
    pCVar5 = (Command *)CONCAT44(extraout_var,iVar4);
    std::
    _Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ::~_Vector_base(&local_88);
  }
  if (pCVar5 == (Command *)0x0) {
    ti_00.ctx = pvVar8;
    ti_00.impl = pvVar9;
    pBVar6 = getBuildSystem(ti_00);
    pBVar2 = pBVar6->delegate;
    pNVar3 = this->node;
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            *)&local_68,&pNVar3->producers);
    (*pBVar2->_vptr_BuildSystemDelegate[0x12])(pBVar2,pNVar3,&local_68);
    std::
    _Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
    ::~_Vector_base(&local_68);
    this->isInvalid = true;
  }
  else {
    this->producingCommand = pCVar5;
    name.Length = sVar7;
    name.Data = (char *)(pCVar5->name)._M_string_length;
    llbuild::buildsystem::BuildKey::makeCommand
              ((BuildKey *)local_50,(BuildKey *)(pCVar5->name)._M_dataplus._M_p,name);
    std::__cxx11::string::string((string *)&local_88,local_50);
    llbuild::core::TaskInterface::request
              ((TaskInterface *)&stack0xffffffffffffff68,(KeyType *)&local_88,0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the producer command.
    auto getCommand = [&]()->Command* {
      if (node.getProducers().size() == 1) {
        return node.getProducers()[0];
      }
      // Give the delegate a chance to resolve to a single command.
      return getBuildSystem(ti).getDelegate().
          chooseCommandFromMultipleProducers(&node, node.getProducers());
    };

    if (Command* foundCommand = getCommand()) {
      producingCommand = foundCommand;
      ti.request(BuildKey::makeCommand(producingCommand->getName()).toData(),
                 /*InputID=*/0);
      return;
    }

    // Notify that we could not resolve to a single producer.
    getBuildSystem(ti).getDelegate().
        cannotBuildNodeDueToMultipleProducers(&node, node.getProducers());
    isInvalid = true;
  }